

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnSimdStoreLaneExpr
          (ExprVisitorDelegate *this,SimdStoreLaneExpr *expr)

{
  WatWriter *this_00;
  bool bVar1;
  char *s;
  SimdStoreLaneExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  this_00 = this->writer_;
  s = Opcode::GetName(&expr->opcode);
  WritePutsSpace(this_00,s);
  WriteMemoryVarUnlessZero(this->writer_,&(expr->super_MemoryExpr<(wabt::ExprType)45>).memidx,Space)
  ;
  if (expr->offset != 0) {
    Writef(this->writer_,"offset=%lu",expr->offset);
  }
  bVar1 = Opcode::IsNaturallyAligned(&expr->opcode,expr->align);
  if (!bVar1) {
    Writef(this->writer_,"align=%lu",expr->align);
  }
  Writef(this->writer_,"%lu",expr->val);
  WriteNewline(this->writer_,false);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnSimdStoreLaneExpr(
    SimdStoreLaneExpr* expr) {
  writer_->WritePutsSpace(expr->opcode.GetName());
  writer_->WriteMemoryVarUnlessZero(expr->memidx, NextChar::Space);
  if (expr->offset) {
    writer_->Writef("offset=%" PRIaddress, expr->offset);
  }
  if (!expr->opcode.IsNaturallyAligned(expr->align)) {
    writer_->Writef("align=%" PRIaddress, expr->align);
  }
  writer_->Writef("%" PRIu64, (expr->val));
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}